

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

int32 accum_gauden(float32 ***denacc,uint32 *lcl2gbl,uint32 n_lcl2gbl,vector_t *frame,
                  uint32 ***den_idx,gauden_t *g,int32 mean_reest,int32 var_reest,int32 pass2var,
                  float32 ***wacc,int32 var_is_full,FILE *pdumpfh,feat_t *fcb)

{
  float x;
  uint uVar1;
  uint uVar2;
  vector_t ***ppppfVar3;
  vector_t ***ppppfVar4;
  vector_t ***ppppfVar5;
  vector_t ****pppppfVar6;
  float32 ***pppfVar7;
  vector_t pfVar8;
  uint32 *puVar9;
  float32 *pfVar10;
  vector_t pfVar11;
  float32 **a;
  uint uVar12;
  ulong uVar13;
  vector_t pfVar14;
  vector_t x_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  vector_t pfVar19;
  float32 **local_e0;
  float32 *local_c0;
  
  ppppfVar3 = g->l_macc;
  ppppfVar4 = g->mean;
  ppppfVar5 = g->l_vacc;
  pppppfVar6 = g->l_fullvacc;
  pppfVar7 = g->l_dnom;
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  local_e0 = (float32 **)0x0;
  local_c0 = (float32 *)0x0;
  pfVar14 = (vector_t)0x0;
  pfVar19 = (vector_t)0x0;
  for (uVar15 = 0; uVar15 != n_lcl2gbl; uVar15 = uVar15 + 1) {
    for (uVar16 = 0; uVar16 < g->n_feat; uVar16 = uVar16 + 1) {
      pfVar8 = frame[uVar16];
      puVar9 = den_idx[uVar15][uVar16];
      pfVar10 = denacc[uVar15][uVar16];
      if (var_is_full != 0) {
        ckd_free_2d(local_e0);
        local_e0 = (float32 **)
                   __ckd_calloc_2d__((ulong)g->veclen[uVar16],(ulong)g->veclen[uVar16],4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                                     ,0xe3);
        ckd_free(local_c0);
        local_c0 = (float32 *)
                   __ckd_calloc__((ulong)g->veclen[uVar16],4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
                                  ,0xe5);
      }
      for (uVar17 = 0; uVar17 != uVar2; uVar17 = uVar17 + 1) {
        uVar12 = (uint)uVar17;
        if (uVar2 != uVar1) {
          uVar12 = puVar9[uVar17];
        }
        uVar18 = (ulong)uVar12;
        x = (float)pfVar10[uVar18];
        if (1.2e-38 < x) {
          if (pdumpfh != (FILE *)0x0) {
            fprintf((FILE *)pdumpfh,"%u %u %u %g\n",(double)x,(ulong)lcl2gbl[uVar15],
                    uVar16 & 0xffffffff,uVar18);
          }
          pfVar11 = ppppfVar3[uVar15][uVar16][uVar18];
          if (pass2var != 0) {
            pfVar19 = ppppfVar4[lcl2gbl[uVar15]][uVar16][uVar18];
          }
          if (var_reest != 0) {
            if (var_is_full == 0) {
              pfVar14 = ppppfVar5[uVar15][uVar16][uVar18];
            }
            else {
              a = (float32 **)pppppfVar6[uVar15][uVar16][uVar18];
              uVar12 = g->veclen[uVar16];
              x_00 = pfVar8;
              if (pass2var != 0) {
                for (uVar13 = 0; x_00 = (vector_t)local_c0, uVar12 != uVar13; uVar13 = uVar13 + 1) {
                  local_c0[uVar13] = (float32)(pfVar8[uVar13] - pfVar19[uVar13]);
                }
              }
              outerproduct(local_e0,(float32 *)x_00,(float32 *)x_00,uVar12);
              scalarmultiply(local_e0,(float32)x,g->veclen[uVar16]);
              matrixadd(a,local_e0,g->veclen[uVar16]);
            }
          }
          if (mean_reest != 0) {
            uVar12 = g->veclen[uVar16];
            for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
              pfVar11[uVar13] = pfVar8[uVar13] * x + pfVar11[uVar13];
            }
          }
          if (var_reest != 0 && var_is_full == 0) {
            uVar12 = g->veclen[uVar16];
            uVar13 = 0;
            if (pass2var == 0) {
              for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
                pfVar14[uVar13] = x * pfVar8[uVar13] * pfVar8[uVar13] + pfVar14[uVar13];
              }
            }
            else {
              for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
                pfVar14[uVar13] =
                     (pfVar8[uVar13] - pfVar19[uVar13]) * (pfVar8[uVar13] - pfVar19[uVar13]) * x +
                     pfVar14[uVar13];
              }
            }
          }
          pppfVar7[uVar15][uVar16][uVar18] = (float32)(x + (float)pppfVar7[uVar15][uVar16][uVar18]);
        }
      }
      if (var_is_full != 0) {
        ckd_free_2d(local_e0);
        ckd_free(local_c0);
        local_e0 = (float32 **)0x0;
        local_c0 = (float32 *)0x0;
      }
    }
  }
  if (pdumpfh != (FILE *)0x0) {
    fputs("\n",(FILE *)pdumpfh);
  }
  return 0;
}

Assistant:

int
accum_gauden(float32 ***denacc,
	     uint32 *lcl2gbl,
	     uint32 n_lcl2gbl,
	     vector_t *frame,
	     uint32 ***den_idx,
	     gauden_t *g,
	     int32 mean_reest,
	     int32 var_reest,
	     int32 pass2var,
	     float32 ***wacc,
	     int32 var_is_full,
	     FILE *pdumpfh,
	     feat_t* fcb)
{
    uint32 g_i, i, j, k, kk, l;

    vector_t ***macc = g->l_macc;	/* local to utt */
    vector_t m;
    vector_t ***mean = g->mean;
    vector_t pm = NULL;

    vector_t ***vacc = g->l_vacc;
    vector_t v = NULL;

    vector_t ****fullvacc = g->l_fullvacc;
    vector_t *fv = NULL;
    vector_t *cov = NULL;
    vector_t dvec = NULL;

    float32 ***dnom = g->l_dnom;

    float32 diff;
    float32 obs_cnt;
    
    int n_top = gauden_n_top(g);
    int n_density = gauden_n_density(g);

    /* for each density family found in the utterance */
    for (i = 0; i < n_lcl2gbl; i++) {

	g_i = lcl2gbl[i];

	/* for each feature */
	for (j = 0; j < gauden_n_feat(g); j++) {
	    vector_t feat = frame[j];
	    uint32* den_idx_row = den_idx[i][j];
	    float32* denacc_row = denacc[i][j];

	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = (vector_t *)ckd_calloc_2d(g->veclen[j], g->veclen[j], sizeof(float32));
		ckd_free(dvec);
		dvec = ckd_calloc(g->veclen[j], sizeof(float32));
	    }
	    

	    /* for each density in the mixture density */
	    for (kk = 0; kk < n_top; kk++) {
		
		if (n_top == n_density)
		    k = kk;
		else
		    k = den_idx_row[kk];	/* i.e. density k is one of the n_top densities */
		
		obs_cnt = denacc_row[k];	/* observation count for density (k) at this time frame
						   given the model */
		
		/* don't bother adding a bunch of
		   essentially zero values */
		if (obs_cnt <= MIN_POS_FLOAT32)
		    continue;

#ifdef ACCUM_VERBOSE
		printf("denacc[%u][%u][%3u] == %.3e\n", i, j, k, obs_cnt);
#endif
		if (pdumpfh)
			fprintf(pdumpfh, "%u %u %u %g\n", lcl2gbl[i], j, k, obs_cnt);

		m = macc[i][j][k];	/* the vector accumulator for mean (i,j,k) */

		if (pass2var) {
		    g_i = lcl2gbl[i];
		    pm = mean[g_i][j][k];	/* the mean (i, j, k) */
		}

		if (var_reest) {
		    if (var_is_full)
			fv = fullvacc[i][j][k];
		    else
			v = vacc[i][j][k];	/* the vector accumulator for variance (i,j,k) */
		}

		if (var_reest && var_is_full) {
		    if (!pass2var)
			outerproduct(cov, feat, feat, g->veclen[j]);
		    else {
			for (l = 0; l < g->veclen[j]; ++l)
			    dvec[l] = feat[l] - pm[l];
			outerproduct(cov, dvec, dvec, g->veclen[j]);
		    }
		    scalarmultiply(cov, obs_cnt, g->veclen[j]);
		    matrixadd(fv, cov, g->veclen[j]);
		}

    	        if (mean_reest) {
		    for (l = 0; l < g->veclen[j]; l++) {
			m[l] += obs_cnt * feat[l];
		    }
		}
		
		if (var_reest && !var_is_full) {
		    if (!pass2var) {
			for (l = 0; l < g->veclen[j]; l++) {
			    /* Always reest vars on untransformed features for now */
			    /* This does NOT work with -2passvar no (for pretty obvious reasons) */
			    v[l] += obs_cnt * feat[l] * feat[l];
			}
		    } else {
			for (l = 0; l < g->veclen[j]; l++) {
			    diff = feat[l] - pm[l];    
			    diff *= diff;
			    v[l] += obs_cnt * diff;
			}
		    }
		}

		/* accumulate observation count for all densities */
		dnom[i][j][k] += obs_cnt;
	    }
	    if (var_is_full) {
		ckd_free_2d((void **)cov);
		cov = NULL;
		ckd_free(dvec);
		dvec = NULL;
	    }
	}
    }

    if (pdumpfh)
	    fputs("\n", pdumpfh);

    return S3_SUCCESS;
}